

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O0

void pzgeom::TPZQuadraticTetra::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *a;
  Fad<double> *e;
  Fad<double> *pFVar3;
  Fad<double> *w;
  TPZFMatrix<Fad<double>_> *this;
  TPZVec<Fad<double>_> *in_RDI;
  Fad<double> zeta;
  Fad<double> eta;
  Fad<double> qsi;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffff4d0;
  Fad<double> *in_stack_fffffffffffff4d8;
  Fad<double> *in_stack_fffffffffffff4e0;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffff4e8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff4f0;
  Fad<double> *in_stack_fffffffffffff500;
  Fad<double> *in_stack_fffffffffffff508;
  Fad<double> *in_stack_fffffffffffff510;
  double in_stack_fffffffffffff518;
  double in_stack_fffffffffffff520;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffff528;
  
  TPZVec<Fad<double>_>::operator[](in_RDI,0);
  Fad<double>::Fad(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  TPZVec<Fad<double>_>::operator[](in_RDI,1);
  Fad<double>::Fad(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  TPZVec<Fad<double>_>::operator[](in_RDI,2);
  Fad<double>::Fad(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  operator+<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator-<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            (in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator-<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            (in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator-<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            (in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            (in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  operator+<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  operator+<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  operator+<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff510);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff510);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff510);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator+<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
                      (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  pFVar2 = TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
                      (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  operator+<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff508,
             in_stack_fffffffffffff500);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)pFVar1,(double)pFVar2);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            (in_stack_fffffffffffff518,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff510);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
  operator-<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff508,
             (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff500);
  a = TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
                 (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>((double)a,in_stack_fffffffffffff510);
  e = TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
                 (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>((double)a,e);
  pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
                      (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>((double)a,e);
  w = TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
                 (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  operator+<Fad<double>,_Fad<double>,_nullptr>(pFVar3,w);
  operator+<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)pFVar3,w);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)pFVar1,(double)pFVar2);
  operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
            ((double)a,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)e);
  operator*<double,_Fad<double>,_nullptr>((double)a,e);
  operator-<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)pFVar3,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)w);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
             (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff4f0,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff4d0);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff4d0);
  operator*<double,_Fad<double>,_nullptr>((double)a,e);
  this = (TPZFMatrix<Fad<double>_> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffff4f0,(int64_t)in_stack_fffffffffffff4e8,
                    (int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=((Fad<double> *)this,in_stack_fffffffffffff4e8);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()
                     (this,(int64_t)in_stack_fffffffffffff4e8,(int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffff4e0,&in_stack_fffffffffffff4d8->val_);
  operator*<double,_Fad<double>,_nullptr>((double)a,e);
  pFVar2 = TPZFMatrix<Fad<double>_>::operator()
                     (this,(int64_t)pFVar1,(int64_t)in_stack_fffffffffffff4e0);
  Fad<double>::operator=
            ((Fad<double> *)this,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar1);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffff4d0);
  pFVar3 = TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)pFVar1,(int64_t)pFVar2);
  Fad<double>::operator=<double,_nullptr>(pFVar2,&pFVar3->val_);
  operator*<double,_Fad<double>,_nullptr>((double)a,e);
  pFVar3 = TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)pFVar1,(int64_t)pFVar2);
  Fad<double>::operator=
            ((Fad<double> *)this,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar1);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar3);
  operator*<double,_Fad<double>,_nullptr>((double)a,e);
  TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)pFVar1,(int64_t)pFVar2);
  Fad<double>::operator=
            ((Fad<double> *)this,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar1);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar3);
  Fad<double>::~Fad(pFVar3);
  Fad<double>::~Fad(pFVar3);
  Fad<double>::~Fad(pFVar3);
  return;
}

Assistant:

void TPZQuadraticTetra::TShape(const TPZVec<T> &par, TPZFMatrix<T> &phi, TPZFMatrix<T> &dphi)
{
	T qsi = par[0], eta = par[1], zeta = par[2];
	
    phi(0,0)  =  (zeta + eta + qsi -1.) * (2.*zeta + 2.*eta + 2.*qsi - 1.);
//    phi(0,0)  =  (qsi + eta + zeta -1.) * (2.*qsi + 2.*eta + 2.*zeta - 1.);
//    phi(0,0)  =  2.*qsi*qsi + 2.*eta*eta + 2.*zeta*zeta + 4.*qsi*eta + 4.*qsi*zeta + 4.*eta*zeta - 3.*qsi - 3.*eta - 3.*zeta + 1.;
	phi(1,0)  =  qsi  * (2.*qsi - 1.);
	phi(2,0)  =  eta  * (2.*eta - 1.);
	phi(3,0)  =  zeta * (2.*zeta - 1.);
	phi(4,0)  = -4.*qsi  * (qsi + eta + zeta -1.);
	phi(5,0)  =  4.*qsi  *  eta;
	phi(6,0)  = -4.*eta  * (qsi + eta + zeta -1.);
	phi(7,0)  = -4.*zeta * (qsi + eta + zeta -1.);
	phi(8,0)  =  4.*qsi  *  zeta;
	phi(9,0)  =  4.*eta  *  zeta;
	
	dphi(0,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(1,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(2,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(0,1) =  -1. + 4.*qsi;
	dphi(1,1) =   0.;
	dphi(2,1) =   0.;
	dphi(0,2) =   0.;
	dphi(1,2) =  -1. + 4.*eta;
	dphi(2,2) =   0.;
	dphi(0,3) =   0.;
	dphi(1,3) =   0.;
	dphi(2,3) =  -1. + 4.*zeta;
	dphi(0,4) =  -4.*(2.*qsi + eta + zeta - 1.);
	dphi(1,4) =  -4.*qsi;
	dphi(2,4) =  -4.*qsi;
	dphi(0,5) =   4.*eta;
	dphi(1,5) =   4.*qsi;
	dphi(2,5) =   0.;
	dphi(0,6) =  -4.*eta;
	dphi(1,6) =  -4.*(qsi + eta + zeta - 1.)-4.*eta;
	dphi(2,6) =  -4.*eta;
	dphi(0,7) =  -4.*zeta;
	dphi(1,7) =  -4.*zeta;
	dphi(2,7) =  -4.*(qsi + eta + zeta - 1.)-4.*zeta;
	dphi(0,8) =   4.*zeta;
	dphi(1,8) =   0.;
	dphi(2,8) =   4.*qsi;
	dphi(0,9) =   0.;
	dphi(1,9) =   4.*zeta;
	dphi(2,9) =   4.*eta;
}